

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Pathie::Path::get_xdg_userdir_setting(string *__return_storage_ptr__,string *setting)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  char *__src;
  runtime_error *prVar5;
  char *__modes;
  undefined1 *puVar6;
  undefined1 auStack_12a8 [15];
  allocator local_1299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  Path userconfig;
  string local_1258;
  char line [256];
  char buf [256];
  char result [4096];
  
  puVar6 = auStack_12a8;
  config_dir();
  std::__cxx11::string::string((string *)&local_1258,"user-dirs.dirs",(allocator *)line);
  join(&userconfig,(Path *)result,&local_1258);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  bVar1 = is_file(&userconfig);
  if (bVar1) {
    __stream = fopen(&userconfig,"r",__modes);
    do {
      do {
        iVar2 = feof(__stream);
        if (iVar2 != 0) {
          fclose(__stream);
          std::__cxx11::string::string
                    ((string *)result,"Unknown XDG directory \'",(allocator *)&local_1298);
          std::operator+(&local_1298,setting,"\' requested.");
          std::__cxx11::string::append((string *)result);
          std::__cxx11::string::_M_dispose();
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,(string *)result);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        memset(line,0,0x100);
        memset(buf,0,0x100);
        fgets(line,0x100,__stream);
      } while ((line[0] == '\n') || (line[0] == '#'));
      strncpy(buf,line + 4,setting->_M_string_length);
      iVar2 = strcmp(buf,(setting->_M_dataplus)._M_p);
    } while (iVar2 != 0);
    fclose(__stream);
    pcVar3 = strchr(line,0x22);
    sVar4 = strcspn(pcVar3 + 1,"\"");
    memset(buf,0,0x100);
    strncpy(buf,pcVar3 + 1,sVar4);
    memset(result,0,0x1000);
    pcVar3 = strstr(buf,"$HOME");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = buf;
    }
    else {
      __src = getenv("HOME");
      if (__src == (char *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_1298,"$HOME not set!",&local_1299);
        std::runtime_error::runtime_error(prVar5,(string *)&local_1298);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      strncpy(result,buf,(long)pcVar3 - (long)buf);
      sVar4 = strlen(result);
      strcpy(result + sVar4,__src);
      sVar4 = strlen(result);
      puVar6 = auStack_12a8 + sVar4;
      pcVar3 = pcVar3 + 5;
    }
    strcpy(puVar6 + 0x270,pcVar3);
    std::__cxx11::string::string((string *)__return_storage_ptr__,result,(allocator *)&local_1298);
  }
  else {
    home();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)result);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string Path::get_xdg_userdir_setting(const std::string& setting)
{
  // XDG user-dirs spec recommends (only) checking for $XDG_CONFIG_HOME/user-dirs.dirs,
  // the files under $XDG_CONFIG_DIRS are not to consider.
  Path userconfig = Path::config_dir().join("user-dirs.dirs");

  if (userconfig.is_file()) {
    FILE* p_file = userconfig.fopen("r");

    char line[256];
    char buf[256];
    bool found = false;
    while (!feof(p_file)) {
      memset(line, 0, 256);
      memset(buf, 0, 256);

      fgets(line, 256, p_file);

      // Ignore comments and empty lines
      if (line[0] == '#' || line[0] == '\n')
        continue;

      // Extract the setting name from the line, e.g. "DOWNLOAD" for
      // "XDG_DOWNLOAD_DIR=...".
      strncpy(buf, line + 4, setting.length()); // +4 for "XDG_"
      if (strcmp(buf, setting.c_str()) == 0) {
        found = true;
        break;
      }
    }

    fclose(p_file);

    // Error out if not found
    if (!found) {
      std::string msg = "Unknown XDG directory '";
      msg += setting + "' requested.";
      throw(std::runtime_error(msg));
    }

    // OK, we have found the correct setting. Extract the value now.
    // »XDG_DOWNLOAD_DIR="$HOME/Downloads"«
    char* start = strchr(line, '"') + 1; // Exclude " itself
    size_t len  = strcspn(start, "\"");

    if (!start) // Malformed
      throw(std::runtime_error("Malformed XDG config file (quote mismatch/missing quotes)!"));

    memset(buf, 0, 256);
    strncpy(buf, start, len);
    // buf now contains the part between the quotes followed by NUL bytes

    char result[PATH_MAX];
    memset(result, 0, PATH_MAX);

    // Replace $HOME with env value of $HOME
    start = strstr(buf, "$HOME");
    if (start) { // Contains $HOME
      char* homestr = getenv("HOME");
      if (!homestr)
        throw(std::runtime_error("$HOME not set!"));

      // Stuff before $HOME
      strncpy(result, buf, ((char*)start) - ((char*)buf)); // Compiler does not allow doing pointer arithmetics with char[], but with char* ??? They should be the same...
      // $HOME replacement
      strcpy(result + strlen(result), homestr);
      // Suff after $HOME ($HOME is exactly 5 chars long)
      strcpy(result + strlen(result), start + 5);
    }
    else { // No $HOME included. Copy everything verbosely.
      strcpy(result, buf);
    }

    // result now holds the final result with lots of NUL bytes at the end.
    return std::string(result);
  }

  // No XDG configuration on this system, use $HOME.
  return Path::home().str();
}